

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O0

apx_error_t
connection_transmit_data_message
          (apx_socketServerConnection_t *self,uint32_t write_address,_Bool more_bit,
          uint8_t *msg_data,int32_t msg_size,int32_t *bytes_available)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  apx_size_t buffer_available;
  apx_size_t bytes_to_send;
  apx_size_t header2_size;
  apx_size_t header1_size;
  apx_size_t payload_size;
  apx_size_t address_size;
  uint8_t header [8];
  int32_t *bytes_available_local;
  int32_t msg_size_local;
  uint8_t *msg_data_local;
  _Bool more_bit_local;
  uint32_t write_address_local;
  apx_socketServerConnection_t *self_local;
  
  if (self == (apx_socketServerConnection_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    header = (uint8_t  [8])bytes_available;
    iVar1 = rmf_needed_encoding_size(write_address);
    uVar2 = iVar1 + msg_size;
    if (self->default_buffer_size < uVar2) {
      self_local._4_4_ = 0x21;
    }
    else {
      uVar3 = numheader_encode32(&payload_size,8,uVar2);
      if (uVar3 == 0) {
        __assert_fail("header1_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                      ,0x16b,
                      "apx_error_t connection_transmit_data_message(apx_socketServerConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                     );
      }
      iVar4 = rmf_address_encode((long)&payload_size + (ulong)uVar3,8 - uVar3,write_address,more_bit
                                );
      if (iVar4 != iVar1) {
        __assert_fail("header2_size == address_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                      ,0x16d,
                      "apx_error_t connection_transmit_data_message(apx_socketServerConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                     );
      }
      iVar1 = adt_bytearray_length(&self->send_buffer);
      if ((iVar1 - self->pending_bytes < uVar3 + iVar4 + uVar2) &&
         (connection_send_packet(self), self->pending_bytes != 0)) {
        __assert_fail("self->pending_bytes == 0u",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                      ,0x173,
                      "apx_error_t connection_transmit_data_message(apx_socketServerConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                     );
      }
      lVar5 = adt_bytearray_data(&self->send_buffer);
      memcpy((void *)(lVar5 + (ulong)self->pending_bytes),&payload_size,(ulong)(uVar3 + iVar4));
      self->pending_bytes = uVar3 + iVar4 + self->pending_bytes;
      lVar5 = adt_bytearray_data(&self->send_buffer);
      memcpy((void *)(lVar5 + (ulong)self->pending_bytes),msg_data,(long)msg_size);
      self->pending_bytes = msg_size + self->pending_bytes;
      iVar1 = adt_bytearray_length(&self->send_buffer);
      *(apx_size_t *)header = iVar1 - self->pending_bytes;
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t connection_transmit_data_message(apx_socketServerConnection_t* self, uint32_t write_address, bool more_bit, uint8_t const* msg_data, int32_t msg_size, int32_t* bytes_available)
{
   if (self != NULL)
   {
      uint8_t header[NUMHEADER32_LONG_SIZE + RMF_HIGH_ADDR_SIZE];
      apx_size_t const address_size = rmf_needed_encoding_size(write_address);
      apx_size_t const payload_size = address_size + msg_size;
      if (payload_size > self->default_buffer_size)
      {
         return APX_MSG_TOO_LARGE_ERROR;
      }
      apx_size_t const header1_size = numheader_encode32(header, sizeof(header), payload_size);
      assert(header1_size > 0);
      apx_size_t const header2_size = rmf_address_encode(header + header1_size, sizeof(header) - header1_size, write_address, more_bit);
      assert(header2_size == address_size);
      apx_size_t const bytes_to_send = header1_size + header2_size + payload_size;
      apx_size_t const buffer_available = ((apx_size_t)adt_bytearray_length(&self->send_buffer)) - self->pending_bytes;
      if (bytes_to_send > buffer_available)
      {
         connection_send_packet(self);
         assert(self->pending_bytes == 0u);
      }
      memcpy(adt_bytearray_data(&self->send_buffer) + self->pending_bytes, header, header1_size + header2_size);
      self->pending_bytes += (header1_size + header2_size);
      memcpy(adt_bytearray_data(&self->send_buffer) + self->pending_bytes, msg_data, msg_size);
      self->pending_bytes += msg_size;
      *bytes_available = (int32_t)(((apx_size_t)adt_bytearray_length(&self->send_buffer)) - self->pending_bytes);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}